

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  socket_t sVar4;
  function<void_(int)> *this_00;
  function<void_(int)> local_70;
  function<void_(int)> local_50;
  
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    pcVar3 = (this->host_)._M_dataplus._M_p;
    iVar2 = this->port_;
    bVar1 = this->tcp_nodelay_;
    this_00 = &local_70;
    std::function<void_(int)>::function(this_00,&this->socket_options_);
    sVar4 = detail::create_client_socket
                      (pcVar3,iVar2,bVar1,this_00,this->connection_timeout_sec_,
                       this->connection_timeout_usec_,&this->interface_,error);
  }
  else {
    pcVar3 = (this->proxy_host_)._M_dataplus._M_p;
    bVar1 = this->tcp_nodelay_;
    this_00 = &local_50;
    std::function<void_(int)>::function(this_00,&this->socket_options_);
    sVar4 = detail::create_client_socket
                      (pcVar3,iVar2,bVar1,this_00,this->connection_timeout_sec_,
                       this->connection_timeout_usec_,&this->interface_,error);
  }
  std::_Function_base::~_Function_base(&this_00->super__Function_base);
  return sVar4;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
		if (!proxy_host_.empty() && proxy_port_ != -1) {
			return detail::create_client_socket(
					proxy_host_.c_str(), proxy_port_, tcp_nodelay_, socket_options_,
					connection_timeout_sec_, connection_timeout_usec_, interface_, error);
		}
		return detail::create_client_socket(
				host_.c_str(), port_, tcp_nodelay_, socket_options_,
				connection_timeout_sec_, connection_timeout_usec_, interface_, error);
	}